

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract_depthmap.cpp
# Opt level: O2

int parse_huawei_trailer
              (uchar *data,size_t size,uchar **cv,size_t *cv_size,uchar **dm,size_t *dm_size,
              size_t *dm_width,size_t *dm_height,image_type_t *dm_type,uint32_t *orientation)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uchar *puVar7;
  uint uVar8;
  uint *puVar9;
  uchar *puVar10;
  long lVar11;
  
  iVar5 = 0;
  if (((data <= data + (size - 8)) && (*(long *)(data + (size - 8)) == 0x6e456874706544)) &&
     (puVar9 = (uint *)(data + (size - 0xc)), data <= puVar9)) {
    uVar4 = *puVar9;
    puVar10 = (uchar *)((long)puVar9 - (ulong)uVar4);
    if (data <= puVar10) {
      puVar7 = data + (size - uVar4);
      for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
        printf("%02X",(ulong)puVar10[lVar6]);
        if ((~(uint)lVar6 & 0xf) == 0) {
          fputs("  ",_stdout);
          for (lVar11 = -0x1b; lVar11 != -0xb; lVar11 = lVar11 + 1) {
            bVar1 = puVar7[lVar11];
            iVar5 = isprint((uint)bVar1);
            uVar8 = (uint)bVar1;
            if (iVar5 == 0) {
              uVar8 = 0x2e;
            }
            putchar(uVar8);
          }
          putchar(10);
        }
        else if ((~(uint)lVar6 & 3) == 0) {
          fputs("   ",_stdout);
        }
        else {
          putchar(0x20);
        }
        puVar7 = puVar7 + 1;
      }
      if ((byte)(puVar10[3] - 0x10) < 4) {
        *orientation = *(uint32_t *)(&DAT_002fa920 + (ulong)(byte)(puVar10[3] - 0x10) * 4);
      }
      uVar2 = *(ushort *)(puVar10 + 0xc);
      uVar3 = *(ushort *)(puVar10 + 0xe);
      uVar8 = (uint)uVar3 * (uint)uVar2;
      iVar5 = 0;
      if (((uVar8 <= uVar4) && (puVar9 = (uint *)(puVar10 + -0xc), data <= puVar9)) &&
         ((*(int *)(puVar10 + -8) == 0x666f6465 && (*(int *)(puVar10 + -4) == 0)))) {
        uVar4 = *puVar9;
        puVar7 = (uchar *)((long)puVar9 - (ulong)uVar4);
        if (data <= puVar7) {
          *cv = puVar7;
          *cv_size = (ulong)uVar4;
          *dm = puVar10 + 0x40;
          *dm_size = (ulong)uVar8;
          *dm_width = (ulong)uVar2;
          *dm_height = (ulong)uVar3;
          *dm_type = TYPE_RAW;
          iVar5 = 1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int parse_huawei_trailer(const unsigned char *data, const size_t size,
                         const unsigned char **cv, size_t *cv_size,
                         const unsigned char **dm, size_t *dm_size,
                         size_t *dm_width, size_t *dm_height, image_type_t *dm_type,
                         uint32_t *orientation) {
    const size_t dm_header_size = 64;

    // check if file ends with "DepthEn\0"
    static const char HUAWEI_END_MARKER[] = {'D', 'e', 'p', 't', 'h', 'E', 'n', '\0'};

    const unsigned char *iter = data + size - sizeof(HUAWEI_END_MARKER);

    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter, HUAWEI_END_MARKER, sizeof(HUAWEI_END_MARKER))) {
        // fprintf(stderr, "trailer doesn't end with \"DepthEn\\0\"\n");
        return 0;
    }

    // The 4 bytes before that are the relative jump to the start of the depth map structure
    iter -= 4;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const uint32_t dm_block_size = read_ui32(iter);

    // go to the start of the data structure where the depth map is in
    iter -= dm_block_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const unsigned char *dm_start = iter;
    const unsigned char *dm_data_start = dm_start + dm_header_size;

    print_hex(file_data, dm_start, dm_header_size);

    switch(dm_start[3]) {
        case 0x10: *orientation = 1; break;
        case 0x11: *orientation = 8; break;
        case 0x12: *orientation = 3; break;
        case 0x13: *orientation = 6; break;
        default: break;
    }

    const uint16_t width = read_ui16(dm_start + 12);
    const uint16_t height = read_ui16(dm_start + 14);

    if (width * height > dm_block_size) {
        // fprintf(stderr, "broken file\n");
        return 0;
    }

    // now we need the original color image
    iter = dm_start - 12;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter + 4, "edof", 4) || read_ui32(iter + 8) != 0) {
        // fprintf(stderr, "unexpected file content\n");
        return 0;
    }

    const uint32_t jpeg_size = read_ui32(iter);

    iter -= jpeg_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    const unsigned char *jpeg_data_start = iter;

    *cv = jpeg_data_start;
    *cv_size = jpeg_size;
    *dm = dm_data_start;
    *dm_size = width * height;
    *dm_width = width;
    *dm_height = height;
    *dm_type = TYPE_RAW;

    return 1;
}